

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void reset_visible_character(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *in_RSI;
  long in_RDI;
  mappos8_t *charpos_out;
  mappos16_t *vispos_in;
  room_t room;
  characterstruct_t *charstr;
  mappos16_t *mappos;
  character_t character;
  undefined4 *local_20;
  
  bVar1 = *in_RSI;
  if (bVar1 != 0xff) {
    if (bVar1 < 0x1a) {
      pbVar3 = (byte *)(in_RDI + 0x170 + (ulong)bVar1 * 7);
      *pbVar3 = *pbVar3 & 0xbf;
      bVar2 = in_RSI[0x3c];
      pbVar3[1] = bVar2;
      in_RSI[7] = 0;
      if (bVar2 == 0) {
        scale_mappos_down((mappos16_t *)(in_RSI + 0x20),(mappos8_t *)(pbVar3 + 2));
      }
      else {
        ((mappos8_t *)(pbVar3 + 2))->u = (uint8_t)((mappos16_t *)(in_RSI + 0x20))->u;
        pbVar3[3] = (byte)*(undefined2 *)(in_RSI + 0x22);
        pbVar3[4] = (byte)*(undefined2 *)(in_RSI + 0x24);
      }
      *in_RSI = 0xff;
      in_RSI[1] = 0xff;
      if ((0xf < bVar1) && (bVar1 < 0x14)) {
        in_RSI[2] = 0xff;
        in_RSI[3] = 0;
        if (0x11 < bVar1) {
          in_RSI[2] = 0xff;
          in_RSI[3] = 0x18;
        }
      }
      *(undefined2 *)(pbVar3 + 5) = *(undefined2 *)(in_RSI + 2);
    }
    else {
      *in_RSI = 0xff;
      in_RSI[1] = 0xff;
      in_RSI[7] = 0;
      if (bVar1 == 0x1a) {
        local_20 = (undefined4 *)(in_RDI + 0x128);
      }
      else if (bVar1 == 0x1b) {
        local_20 = (undefined4 *)(in_RDI + 0x158);
      }
      else {
        local_20 = (undefined4 *)(in_RDI + 0x140);
      }
      *local_20 = *(undefined4 *)(in_RSI + 0x20);
      *(undefined2 *)(local_20 + 1) = *(undefined2 *)(in_RSI + 0x24);
    }
  }
  return;
}

Assistant:

void reset_visible_character(tgestate_t *state, vischar_t *vischar)
{
  character_t        character; /* was A */
  mappos16_t        *mappos;    /* was DE */
  characterstruct_t *charstr;   /* was DE */
  room_t             room;      /* was A */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  character = vischar->character;
  if (character == character_NONE)
    return;

  if (character >= character_26_STOVE_1)
  {
    /* A stove or crate character. */

    vischar->character         = character_NONE;
    vischar->flags             = vischar_FLAGS_EMPTY_SLOT; /* flags */
    vischar->counter_and_flags = 0;    /* more flags */

    /* Save the old position. */
    if (character == character_26_STOVE_1)
      mappos = &state->movable_items[movable_item_STOVE1].mappos;
    else if (character == character_27_STOVE_2)
      mappos = &state->movable_items[movable_item_STOVE2].mappos;
    else
      mappos = &state->movable_items[movable_item_CRATE].mappos;

    /* The DOS version of the game has a difference here. Instead of
     * memcpy'ing the current vischar's position into the movable_items's
     * position, it only copies the first two bytes. The code is setup for a
     * copy of six bytes (cx is set to 3) but the 'movsw' ought to be a 'rep
     * movsw' for it to work. It fixes the bug where stoves get left in place
     * after a restarted game, but almost looks like an accident.
     */
    memcpy(mappos, &vischar->mi.mappos, sizeof(*mappos));
  }
  else
  {
    mappos16_t *vispos_in;   /* was HL */
    mappos8_t  *charpos_out; /* was DE */

    /* A non-object character. */

    charstr = &state->character_structs[character];

    /* Re-enable the character. */
    charstr->character_and_flags &= ~characterstruct_FLAG_ON_SCREEN;

    room = vischar->room;
    charstr->room = room;

    vischar->counter_and_flags = 0; /* more flags */

    /* Save the old position. */

    vispos_in   = &vischar->mi.mappos;
    charpos_out = &charstr->mappos;

    if (room == room_0_OUTDOORS)
    {
      /* Outdoors. */
      scale_mappos_down(vispos_in, charpos_out);
    }
    else
    {
      /* Indoors. */
      /* Conv: Unrolled from original code. */
      charpos_out->u = vispos_in->u; // note: narrowing
      charpos_out->v = vispos_in->v; // note: narrowing
      charpos_out->w = vispos_in->w; // note: narrowing
    }

    // character = vischar->character; /* Done in original code, but we already have this from earlier. */
    vischar->character = character_NONE;
    vischar->flags     = vischar_FLAGS_EMPTY_SLOT;

    /* Guard dogs only. */
    if (character >= character_16_GUARD_DOG_1 &&
        character <= character_19_GUARD_DOG_4)
    {
      /* Choose random locations in the fenced off area (right side). */
      vischar->route.index = routeindex_255_WANDER; /* 0..7 */
      vischar->route.step  = 0;
      if (character >= character_18_GUARD_DOG_3) /* Characters 18 and 19 */
      {
        /* Choose random locations in the fenced off area (bottom side). */
        vischar->route.index = routeindex_255_WANDER; /* 24..31 */
        vischar->route.step  = 24;
      }
    }

    charstr->route = vischar->route;
  }
}